

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O1

int update_lib_bindings(Elf64_Sym *symbol,char *name,Elf64_Addr offset,link_map *lmap,
                       hash_table_t *lookuptable)

{
  int iVar1;
  int extraout_EAX;
  internal_binding_t *internal_binding;
  hash_data_t local_20;
  
  local_20 = (hash_data_t)0x0;
  iVar1 = lookup_hashtable((hash_table_t *)lmap,symbol,&local_20);
  if (iVar1 == 0) {
    *(undefined8 *)(name + *(long *)offset) = *(undefined8 *)(*(long *)((long)local_20 + 8) + 8);
    iVar1 = 0x284804;
    if (2 < debug_level) {
      update_lib_bindings_cold_1();
      iVar1 = extraout_EAX;
    }
  }
  return iVar1;
}

Assistant:

static int update_lib_bindings(ElfW(Sym) * symbol KNOWN_UNUSED, char *name,
                               ElfW(Addr) offset, struct link_map *lmap,
                               hash_table_t *lookuptable) {
  int result = 0;
  struct internal_binding_t *internal_binding = NULL;
  void **got_address = NULL;

  result = lookup_hashtable(lookuptable, name, (void **)&internal_binding);
  if (result != 0) return -1;
  got_address = (void **)(lmap->l_addr + offset);
  writeAddress(got_address, internal_binding->user_binding->wrapper_pointer);
  debug_printf(3, "Remapped call to %s at 0x%lx in %s to wrapper at 0x%p\n",
               name, (lmap->l_addr + offset), LIB_NAME(lmap),
               internal_binding->user_binding->wrapper_pointer);
  return 0;
}